

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_audioview.cpp
# Opt level: O0

void FSSAudioView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  FSSAudioView *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      on_duration_changed((FSSAudioView *)_o,*_a[1]);
    }
    else if (_id == 1) {
      on_position_changed((FSSAudioView *)_o,*_a[1]);
    }
  }
  return;
}

Assistant:

void FSSAudioView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<FSSAudioView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->on_duration_changed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 1: _t->on_position_changed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        default: ;
        }
    }
}